

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::
genTessellationControlSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  char *pcVar2;
  byte local_1a5;
  undefined1 local_198 [8];
  ostringstream buf;
  bool tessellationWidePoints;
  PointRenderCase *this_local;
  
  local_1a5 = 0;
  if ((*(byte *)((long)this + 0xd8) & 1) != 0) {
    local_1a5 = *(byte *)((long)this + 0x81) ^ 0xff;
  }
  buf._375_1_ = local_1a5 & 1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar1 = std::operator<<((ostream *)local_198,
                           "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${PRIMITIVE_BOUNDING_BOX_REQUIRE}\n"
                          );
  pcVar2 = "";
  if ((buf._375_1_ & 1) != 0) {
    pcVar2 = "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,
                  "layout(vertices=1) out;\nin highp vec4 vtx_color[];\nout highp vec4 tess_ctrl_color[];\nuniform highp float u_tessellationLevel;\nuniform highp vec4 u_posScale;\n"
                 );
  if ((*(byte *)((long)this + 0x83) & 1) == 0) {
    std::operator<<((ostream *)local_198,
                    "uniform highp vec4 u_primitiveBBoxMin;\nuniform highp vec4 u_primitiveBBoxMax;\n"
                   );
  }
  std::operator<<((ostream *)local_198,
                  "patch out highp vec3 vp_bbox_clipMin;\npatch out highp vec3 vp_bbox_clipMax;\n");
  if ((*(byte *)((long)this + 0x83) & 1) != 0) {
    std::operator<<((ostream *)local_198,"\n");
    if ((*(byte *)((long)this + 0x81) & 1) != 0) {
      pcVar2 = anon_unknown_1::BBoxRenderCase::genShaderFunction
                         ((BBoxRenderCase *)this,SHADER_FUNC_MIRROR_X);
      std::operator<<((ostream *)local_198,pcVar2);
    }
    pcVar2 = anon_unknown_1::BBoxRenderCase::genShaderFunction
                       ((BBoxRenderCase *)this,SHADER_FUNC_MIRROR_Y);
    std::operator<<((ostream *)local_198,pcVar2);
    poVar1 = std::operator<<((ostream *)local_198,"vec4 transformVec(in highp vec4 p)\n{\n\treturn "
                            );
    pcVar2 = "mirrorY(p)";
    if ((*(byte *)((long)this + 0x81) & 1) != 0) {
      pcVar2 = "mirrorX(mirrorY(p))";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,";\n}\n");
  }
  std::operator<<((ostream *)local_198,
                  "\nvoid main()\n{\n\t// convert to nonsensical coordinates, just in case\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position.wzxy;\n\ttess_ctrl_color[gl_InvocationID] = vtx_color[gl_InvocationID];\n\n\tgl_TessLevelOuter[0] = u_tessellationLevel;\n\tgl_TessLevelOuter[1] = u_tessellationLevel;\n\tgl_TessLevelOuter[2] = u_tessellationLevel;\n\tgl_TessLevelOuter[3] = u_tessellationLevel;\n\tgl_TessLevelInner[0] = 0.8; // will be rounded up to 1\n\tgl_TessLevelInner[1] = 0.8; // will be rounded up to 1\n"
                 );
  if ((*(byte *)((long)this + 0x83) & 1) == 0) {
    std::operator<<((ostream *)local_198,
                    "\n\thighp vec4 bboxMin = u_primitiveBBoxMin;\n\thighp vec4 bboxMax = u_primitiveBBoxMax;\n"
                   );
  }
  else {
    std::operator<<((ostream *)local_198,"\n");
    if ((*(byte *)((long)this + 0x81) & 1) == 0) {
      std::operator<<((ostream *)local_198,
                      "\tconst vec2 minExpansion = vec2(0.07, 0.07); // eval shader\n\tconst vec2 maxExpansion = vec2(0.07, 0.07); // eval shader\n"
                     );
    }
    else {
      std::operator<<((ostream *)local_198,
                      "\tconst vec2 minExpansion = vec2(0.07 + 0.05, 0.07 + 0.02); // eval and geometry shader\n\tconst vec2 maxExpansion = vec2(0.07 + 0.05, 0.07 + 0.03); // eval and geometry shader\n"
                     );
    }
    std::operator<<((ostream *)local_198,
                    "\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec4 bboxMin = transformVec(gl_in[0].gl_Position) - vec4(minExpansion * patternScale, 0.0, 0.0);\n\thighp vec4 bboxMax = transformVec(gl_in[0].gl_Position) + vec4(maxExpansion * patternScale, 0.0, 0.0);\n"
                   );
  }
  if ((*(byte *)((long)this + 0x82) & 1) == 0) {
    std::operator<<((ostream *)local_198,
                    "\n\t${PRIM_GL_BOUNDING_BOX}[0] = bboxMin;\n\t${PRIM_GL_BOUNDING_BOX}[1] = bboxMax;\n"
                   );
  }
  std::operator<<((ostream *)local_198,
                  "\tvp_bbox_clipMin = min(vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMin.w,\n\t                      vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMax.w);\n\tvp_bbox_clipMax = max(vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMin.w,\n\t                      vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMax.w);\n}\n"
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string PointRenderCase::genTessellationControlSource (void) const
{
	const bool			tessellationWidePoints = (m_isWidePointCase) && (!m_hasGeometryStage);
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
			"${PRIMITIVE_BOUNDING_BOX_REQUIRE}\n"
		<<	((tessellationWidePoints) ? ("${TESSELLATION_POINT_SIZE_REQUIRE}\n") : (""))
		<<	"layout(vertices=1) out;"
			"\n"
			"in highp vec4 vtx_color[];\n"
			"out highp vec4 tess_ctrl_color[];\n"
			"uniform highp float u_tessellationLevel;\n"
			"uniform highp vec4 u_posScale;\n";

	if (!m_calcPerPrimitiveBBox)
	{
		buf <<	"uniform highp vec4 u_primitiveBBoxMin;\n"
				"uniform highp vec4 u_primitiveBBoxMax;\n";
	}

	buf <<	"patch out highp vec3 vp_bbox_clipMin;\n"
			"patch out highp vec3 vp_bbox_clipMax;\n";

	if (m_calcPerPrimitiveBBox)
	{
		buf <<	"\n";
		if (m_hasGeometryStage)
			buf << genShaderFunction(SHADER_FUNC_MIRROR_X);
		buf << genShaderFunction(SHADER_FUNC_MIRROR_Y);

		buf <<	"vec4 transformVec(in highp vec4 p)\n"
				"{\n"
				"	return " << ((m_hasGeometryStage) ? ("mirrorX(mirrorY(p))") : ("mirrorY(p)")) << ";\n"
				"}\n";
	}

	buf <<	"\n"
			"void main()\n"
			"{\n"
			"	// convert to nonsensical coordinates, just in case\n"
			"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position.wzxy;\n"
			"	tess_ctrl_color[gl_InvocationID] = vtx_color[gl_InvocationID];\n"
			"\n"
			"	gl_TessLevelOuter[0] = u_tessellationLevel;\n"
			"	gl_TessLevelOuter[1] = u_tessellationLevel;\n"
			"	gl_TessLevelOuter[2] = u_tessellationLevel;\n"
			"	gl_TessLevelOuter[3] = u_tessellationLevel;\n"
			"	gl_TessLevelInner[0] = 0.8; // will be rounded up to 1\n"
			"	gl_TessLevelInner[1] = 0.8; // will be rounded up to 1\n";

	if (m_calcPerPrimitiveBBox)
	{
		buf <<	"\n";

		if (m_hasGeometryStage)
			buf <<	"	const vec2 minExpansion = vec2(0.07 + 0.05, 0.07 + 0.02); // eval and geometry shader\n"
					"	const vec2 maxExpansion = vec2(0.07 + 0.05, 0.07 + 0.03); // eval and geometry shader\n";
		else
			buf <<	"	const vec2 minExpansion = vec2(0.07, 0.07); // eval shader\n"
					"	const vec2 maxExpansion = vec2(0.07, 0.07); // eval shader\n";

		buf <<	"	highp vec2 patternScale = u_posScale.zw;\n"
				"	highp vec4 bboxMin = transformVec(gl_in[0].gl_Position) - vec4(minExpansion * patternScale, 0.0, 0.0);\n"
				"	highp vec4 bboxMax = transformVec(gl_in[0].gl_Position) + vec4(maxExpansion * patternScale, 0.0, 0.0);\n";
	}
	else
	{
		buf <<	"\n"
				"	highp vec4 bboxMin = u_primitiveBBoxMin;\n"
				"	highp vec4 bboxMax = u_primitiveBBoxMax;\n";
	}
	if (!m_useGlobalState)
		buf <<	"\n"
				"	${PRIM_GL_BOUNDING_BOX}[0] = bboxMin;\n"
				"	${PRIM_GL_BOUNDING_BOX}[1] = bboxMax;\n";

	buf <<	"	vp_bbox_clipMin = min(vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMin.w,\n"
			"	                      vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMax.w);\n"
			"	vp_bbox_clipMax = max(vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMin.w,\n"
			"	                      vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMax.w);\n"
			"}\n";

	return buf.str();
}